

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void avx::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t minThreshold,uint8_t maxThreshold,uint32_t simdWidth,
                   uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined7 in_register_00000089;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  uint8_t *puVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  auVar7 = vpbroadcastb_avx512vl();
  if ((int)CONCAT71(in_register_00000089,minThreshold) == 0) {
    if (outY != outYEnd) {
      auVar8[8] = 0x80;
      auVar8._0_8_ = 0x8080808080808080;
      auVar8[9] = 0x80;
      auVar8[10] = 0x80;
      auVar8[0xb] = 0x80;
      auVar8[0xc] = 0x80;
      auVar8[0xd] = 0x80;
      auVar8[0xe] = 0x80;
      auVar8[0xf] = 0x80;
      auVar8[0x10] = 0x80;
      auVar8[0x11] = 0x80;
      auVar8[0x12] = 0x80;
      auVar8[0x13] = 0x80;
      auVar8[0x14] = 0x80;
      auVar8[0x15] = 0x80;
      auVar8[0x16] = 0x80;
      auVar8[0x17] = 0x80;
      auVar8[0x18] = 0x80;
      auVar8[0x19] = 0x80;
      auVar8[0x1a] = 0x80;
      auVar8[0x1b] = 0x80;
      auVar8[0x1c] = 0x80;
      auVar8[0x1d] = 0x80;
      auVar8[0x1e] = 0x80;
      auVar8[0x1f] = 0x80;
      puVar3 = outY + totalSimdWidth;
      puVar6 = inY + totalSimdWidth;
      do {
        if (simdWidth != 0) {
          lVar4 = 0;
          do {
            auVar9 = vpcmpgtb_avx2(auVar8 ^ *(undefined1 (*) [32])(inY + lVar4),auVar7);
            auVar9 = vpternlogq_avx512vl(auVar9,auVar9,auVar9,0xf);
            *(undefined1 (*) [32])(outY + lVar4) = auVar9;
            lVar4 = lVar4 + 0x20;
          } while ((ulong)simdWidth << 5 != lVar4);
        }
        if (nonSimdWidth != 0) {
          uVar5 = 0;
          do {
            puVar3[uVar5] = (maxThreshold < puVar6[uVar5]) + 0xff;
            uVar5 = uVar5 + 1;
          } while (nonSimdWidth != uVar5);
        }
        outY = outY + rowSizeOut;
        inY = inY + rowSizeIn;
        puVar3 = puVar3 + rowSizeOut;
        puVar6 = puVar6 + rowSizeIn;
      } while (outY != outYEnd);
    }
  }
  else if (outY != outYEnd) {
    auVar9[8] = 0x80;
    auVar9._0_8_ = 0x8080808080808080;
    auVar9[9] = 0x80;
    auVar9[10] = 0x80;
    auVar9[0xb] = 0x80;
    auVar9[0xc] = 0x80;
    auVar9[0xd] = 0x80;
    auVar9[0xe] = 0x80;
    auVar9[0xf] = 0x80;
    auVar9[0x10] = 0x80;
    auVar9[0x11] = 0x80;
    auVar9[0x12] = 0x80;
    auVar9[0x13] = 0x80;
    auVar9[0x14] = 0x80;
    auVar9[0x15] = 0x80;
    auVar9[0x16] = 0x80;
    auVar9[0x17] = 0x80;
    auVar9[0x18] = 0x80;
    auVar9[0x19] = 0x80;
    auVar9[0x1a] = 0x80;
    auVar9[0x1b] = 0x80;
    auVar9[0x1c] = 0x80;
    auVar9[0x1d] = 0x80;
    auVar9[0x1e] = 0x80;
    auVar9[0x1f] = 0x80;
    puVar3 = outY + totalSimdWidth;
    puVar6 = inY + totalSimdWidth;
    auVar8 = vpbroadcastb_avx512vl();
    do {
      if (simdWidth != 0) {
        lVar4 = 0;
        do {
          uVar1 = vpcmpb_avx512vl(auVar9 ^ *(undefined1 (*) [32])(inY + lVar4),auVar7,2);
          uVar5 = vpcmpgtb_avx512vl(auVar9 ^ *(undefined1 (*) [32])(inY + lVar4),auVar8);
          auVar2 = vpmovm2b_avx512vl(uVar1 & uVar5);
          *(undefined1 (*) [32])(outY + lVar4) = auVar2;
          lVar4 = lVar4 + 0x20;
        } while ((ulong)simdWidth << 5 != lVar4);
      }
      if (nonSimdWidth != 0) {
        uVar5 = 0;
        do {
          puVar3[uVar5] = -(puVar6[uVar5] <= maxThreshold && minThreshold <= puVar6[uVar5]);
          uVar5 = uVar5 + 1;
        } while (nonSimdWidth != uVar5);
      }
      outY = outY + rowSizeOut;
      inY = inY + rowSizeIn;
      puVar3 = puVar3 + rowSizeOut;
      puVar6 = puVar6 + rowSizeIn;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t minThreshold, uint8_t maxThreshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char shiftMaskValue = static_cast<char>(0x80u);
        const simd shiftMask = _mm256_set_epi8(
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue );

        const char notMaskValue = static_cast<char>(0xffu);
        const simd notMask = _mm256_set_epi8(
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue,
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue,
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue,
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue );

        const char maxCompareValue = static_cast<char>(maxThreshold ^ 0x80u);
        const simd maxCompare = _mm256_set_epi8(
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue );

        if( minThreshold > 0 ) {
            const char minCompareValue = static_cast<char>((minThreshold - 1) ^ 0x80u);
            const simd minCompare = _mm256_set_epi8(
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue );


            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst ) {
                    simd data = _mm256_xor_si256( _mm256_loadu_si256( src1 ), shiftMask );

                    _mm256_storeu_si256( dst, _mm256_and_si256(
                        _mm256_andnot_si256(
                            _mm256_cmpgt_epi8( data, maxCompare ), notMask ),
                        _mm256_cmpgt_epi8( data, minCompare ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
                }
            }
        }
        else {
            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst ) {
                    simd data = _mm256_xor_si256( _mm256_loadu_si256( src1 ), shiftMask );

                    _mm256_storeu_si256( dst, _mm256_andnot_si256( _mm256_cmpgt_epi8( data, maxCompare ), notMask ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
                }
            }
        }
    }